

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool google::protobuf::compiler::js::anon_unknown_0::HasMap
               (GeneratorOptions *options,Descriptor *desc)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = *(int *)((long)&(options->namespace_prefix)._M_string_length + 4);
  bVar5 = 0 < iVar1;
  if (0 < iVar1) {
    bVar3 = FieldDescriptor::is_map
                      ((FieldDescriptor *)(options->namespace_prefix).field_2._M_allocated_capacity)
    ;
    if (!bVar3) {
      lVar7 = 0;
      lVar6 = 0xa8;
      do {
        lVar7 = lVar7 + 1;
        lVar4 = (long)*(int *)((long)&(options->namespace_prefix)._M_string_length + 4);
        bVar5 = lVar7 < lVar4;
        if (lVar4 <= lVar7) goto LAB_0021fc55;
        bVar3 = FieldDescriptor::is_map
                          ((FieldDescriptor *)
                           (lVar6 + (options->namespace_prefix).field_2._M_allocated_capacity));
        lVar6 = lVar6 + 0xa8;
      } while (!bVar3);
    }
    if (bVar5) {
      return true;
    }
  }
LAB_0021fc55:
  iVar1._0_1_ = options->add_require_for_enums;
  iVar1._1_1_ = options->testonly;
  iVar1._2_2_ = *(undefined2 *)&options->field_0x4a;
  bVar5 = 0 < iVar1;
  if ((0 < iVar1) &&
     (bVar3 = HasMap((GeneratorOptions *)(options->library)._M_dataplus._M_p,desc), !bVar3)) {
    lVar7 = 0;
    lVar6 = 0xa8;
    do {
      lVar7 = lVar7 + 1;
      iVar2._0_1_ = options->add_require_for_enums;
      iVar2._1_1_ = options->testonly;
      iVar2._2_2_ = *(undefined2 *)&options->field_0x4a;
      bVar5 = lVar7 < iVar2;
      if (iVar2 <= lVar7) {
        return bVar5;
      }
      bVar3 = HasMap((GeneratorOptions *)((options->library)._M_dataplus._M_p + lVar6),desc);
      lVar6 = lVar6 + 0xa8;
    } while (!bVar3);
  }
  return bVar5;
}

Assistant:

bool HasMap(const GeneratorOptions& options, const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (IsMap(options, desc->field(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasMap(options, desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}